

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O0

int uv_getaddrinfo(uv_loop_t *loop,uv_getaddrinfo_t *req,uv_getaddrinfo_cb cb,char *hostname,
                  char *service,addrinfo *hints)

{
  size_t sVar1;
  long lVar2;
  addrinfo *__dest;
  size_t local_198;
  size_t local_190;
  long rc;
  char *buf;
  size_t len;
  size_t hints_len;
  size_t service_len;
  size_t hostname_len;
  char hostname_ascii [256];
  addrinfo *hints_local;
  char *service_local;
  char *hostname_local;
  uv_getaddrinfo_cb cb_local;
  uv_getaddrinfo_t *req_local;
  uv_loop_t *loop_local;
  
  if ((req == (uv_getaddrinfo_t *)0x0) || ((hostname == (char *)0x0 && (service == (char *)0x0)))) {
    loop_local._4_4_ = -0x16;
  }
  else {
    service_local = hostname;
    if (hostname != (char *)0x0) {
      sVar1 = strlen(hostname);
      lVar2 = uv__idna_toascii(hostname,hostname + sVar1,(char *)&hostname_len,hostname_ascii + 0xf8
                              );
      if (lVar2 < 0) {
        return (int)lVar2;
      }
      service_local = (char *)&hostname_len;
    }
    if (service_local == (char *)0x0) {
      local_190 = 0;
    }
    else {
      local_190 = strlen(service_local);
      local_190 = local_190 + 1;
    }
    if (service == (char *)0x0) {
      local_198 = 0;
    }
    else {
      local_198 = strlen(service);
      local_198 = local_198 + 1;
    }
    lVar2 = 0;
    if (hints != (addrinfo *)0x0) {
      lVar2 = 0x30;
    }
    __dest = (addrinfo *)uv__malloc(local_190 + local_198 + lVar2);
    if (__dest == (addrinfo *)0x0) {
      loop_local._4_4_ = -0xc;
    }
    else {
      req->type = UV_GETADDRINFO;
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      req->loop = loop;
      req->cb = cb;
      req->addrinfo = (addrinfo *)0x0;
      req->hints = (addrinfo *)0x0;
      req->service = (char *)0x0;
      req->hostname = (char *)0x0;
      req->retcode = 0;
      buf = (char *)0x0;
      if (hints != (addrinfo *)0x0) {
        memcpy(__dest,hints,0x30);
        req->hints = __dest;
        buf = (char *)0x30;
      }
      if (service != (char *)0x0) {
        memcpy(buf + (long)&__dest->ai_flags,service,local_198);
        req->service = buf + (long)&__dest->ai_flags;
        buf = buf + local_198;
      }
      if (service_local != (char *)0x0) {
        memcpy(buf + (long)&__dest->ai_flags,service_local,local_190);
        req->hostname = buf + (long)&__dest->ai_flags;
      }
      if (cb == (uv_getaddrinfo_cb)0x0) {
        uv__getaddrinfo_work(&req->work_req);
        uv__getaddrinfo_done(&req->work_req,0);
        loop_local._4_4_ = req->retcode;
      }
      else {
        uv__work_submit(loop,&req->work_req,UV__WORK_SLOW_IO,uv__getaddrinfo_work,
                        uv__getaddrinfo_done);
        loop_local._4_4_ = 0;
      }
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_getaddrinfo(uv_loop_t* loop,
                   uv_getaddrinfo_t* req,
                   uv_getaddrinfo_cb cb,
                   const char* hostname,
                   const char* service,
                   const struct addrinfo* hints) {
  char hostname_ascii[256];
  size_t hostname_len;
  size_t service_len;
  size_t hints_len;
  size_t len;
  char* buf;
  long rc;

  if (req == NULL || (hostname == NULL && service == NULL))
    return UV_EINVAL;

  /* FIXME(bnoordhuis) IDNA does not seem to work z/OS,
   * probably because it uses EBCDIC rather than ASCII.
   */
#ifdef __MVS__
  (void) &hostname_ascii;
#else
  if (hostname != NULL) {
    rc = uv__idna_toascii(hostname,
                          hostname + strlen(hostname),
                          hostname_ascii,
                          hostname_ascii + sizeof(hostname_ascii));
    if (rc < 0)
      return rc;
    hostname = hostname_ascii;
  }
#endif

  hostname_len = hostname ? strlen(hostname) + 1 : 0;
  service_len = service ? strlen(service) + 1 : 0;
  hints_len = hints ? sizeof(*hints) : 0;
  buf = uv__malloc(hostname_len + service_len + hints_len);

  if (buf == NULL)
    return UV_ENOMEM;

  uv__req_init(loop, req, UV_GETADDRINFO);
  req->loop = loop;
  req->cb = cb;
  req->addrinfo = NULL;
  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;
  req->retcode = 0;

  /* order matters, see uv_getaddrinfo_done() */
  len = 0;

  if (hints) {
    req->hints = memcpy(buf + len, hints, sizeof(*hints));
    len += sizeof(*hints);
  }

  if (service) {
    req->service = memcpy(buf + len, service, service_len);
    len += service_len;
  }

  if (hostname)
    req->hostname = memcpy(buf + len, hostname, hostname_len);

  if (cb) {
    uv__work_submit(loop,
                    &req->work_req,
                    UV__WORK_SLOW_IO,
                    uv__getaddrinfo_work,
                    uv__getaddrinfo_done);
    return 0;
  } else {
    uv__getaddrinfo_work(&req->work_req);
    uv__getaddrinfo_done(&req->work_req, 0);
    return req->retcode;
  }
}